

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int local_14;
  
  pCVar1 = L->ci;
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  local_14 = n;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x69,"int lua_checkstack(lua_State *, int)");
  }
  if (-1 < (long)n) {
    uVar3 = 1;
    if (((long)L->stack_last - (long)L->top >> 4 <= (long)n) &&
       (uVar3 = 0, (int)((ulong)((long)L->top - (long)L->stack) >> 4) + 5 <= 1000000 - n)) {
      iVar4 = luaD_rawrunprotected(L,growstack,&local_14);
      uVar3 = (uint)(iVar4 == 0);
    }
    if ((uVar3 != 0) && (pCVar1->top < L->top + local_14)) {
      pCVar1->top = L->top + local_14;
    }
    piVar2 = *(int **)&L[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      return uVar3;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x76,"int lua_checkstack(lua_State *, int)");
  }
  __assert_fail("(n >= 0) && \"negative \'n\'\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x6a,"int lua_checkstack(lua_State *, int)");
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last - L->top > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - n)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &n) == LUA_OK);
  }
  if (res && ci->top < L->top + n)
    ci->top = L->top + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}